

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_ss.c
# Opt level: O0

int sourceGetbuf(gdIOCtx *ctx,void *buf,int size)

{
  int res;
  ssIOCtx *lctx;
  int size_local;
  void *buf_local;
  gdIOCtx *ctx_local;
  
  ctx_local._4_4_ = (**(code **)ctx[1].getC)(*(undefined8 *)(ctx[1].getC + 8),buf,size);
  if (ctx_local._4_4_ == 0) {
    ctx_local._4_4_ = 0;
  }
  else if (ctx_local._4_4_ < 0) {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int sourceGetbuf(gdIOCtx *ctx, void *buf, int size)
{
	ssIOCtx *lctx;
	int res;

	lctx = (ssIOCtx *)ctx;

	res = ((lctx->src->source)(lctx->src->context, buf, size));

	/*
	 * Translate the return values from the Source object:
	 * 0 is EOF, -1 is error
	 */

	if (res == 0) {
		return 0;
	} else if (res < 0) {
		return 0;
	} else {
		return res;
	}
}